

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

key_view __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::iterator::get_key(iterator *this)

{
  bool bVar1;
  node_type nVar2;
  reference this_00;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *this_01;
  key_view kVar3;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *leaf;
  node_ptr *node;
  value_type *e;
  iterator *this_local;
  
  bVar1 = valid(this);
  if (!bVar1) {
    __assert_fail("valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0xa4d,
                  "key_view unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::get_key() [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
                 );
  }
  this_00 = std::
            stack<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::deque<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>_>
            ::top(&this->stack_);
  nVar2 = detail::basic_node_ptr<unodb::detail::olc_node_header>::type
                    ((basic_node_ptr<unodb::detail::olc_node_header> *)this_00);
  if (nVar2 == LEAF) {
    this_01 = detail::basic_node_ptr<unodb::detail::olc_node_header>::
              ptr<unodb::detail::basic_leaf<std::span<std::byte_const,18446744073709551615ul>,unodb::detail::olc_node_header>*>
                        ((basic_node_ptr<unodb::detail::olc_node_header> *)this_00);
    kVar3 = detail::
            basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
            ::get_key_view(this_01);
    return kVar3;
  }
  __assert_fail("node.type() == node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0xa5a,
                "key_view unodb::olc_db<std::span<const std::byte>, std::span<const std::byte>>::iterator::get_key() [Key = std::span<const std::byte>, Value = std::span<const std::byte>]"
               );
}

Assistant:

key_view olc_db<Key, Value>::iterator::get_key() noexcept {
  UNODB_DETAIL_ASSERT(valid());  // by contract
  // Note: If the iterator is on a leaf, we return the key for that
  // leaf regardless of whether the leaf has been deleted.  This is
  // part of the design semantics for the OLC ART scan.
  //
  // TODO(thompsonbry) : variable length keys. The simplest case
  // where this does not work today is a single root leaf.  In that
  // case, there is no inode path and we can not properly track the
  // key in the key_buffer.
  //
  // return keybuf_.get_key_view();
  const auto& e = stack_.top();
  const auto& node = e.node;
  UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);      // On a leaf.
  const auto* const leaf{node.template ptr<leaf_type*>()};  // current leaf.
  return leaf->get_key_view();
}